

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lvm.c
# Opt level: O3

void raviV_op_shr(lua_State *L,TValue *ra,TValue *rb,TValue *rc)

{
  GCObject *pGVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  double dVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  
  if (rb->tt_ == 3) {
    auVar6._8_8_ = 0;
    auVar6._0_8_ = (rb->value_).n;
    auVar6 = vroundsd_avx(auVar6,auVar6,9);
    dVar5 = auVar6._0_8_;
    if (((dVar5 != (rb->value_).n) || (dVar5 < -9.223372036854776e+18)) ||
       (9.223372036854776e+18 <= dVar5)) goto LAB_00131d03;
    uVar3 = (ulong)dVar5;
  }
  else {
    if (rb->tt_ != 0x13) goto LAB_00131d03;
    uVar3 = (rb->value_).i;
  }
  if (rc->tt_ == 3) {
    auVar7._8_8_ = 0;
    auVar7._0_8_ = (rc->value_).n;
    auVar6 = vroundsd_avx(auVar7,auVar7,9);
    dVar5 = auVar6._0_8_;
    if (((dVar5 != (rc->value_).n) || (dVar5 < -9.223372036854776e+18)) ||
       (9.223372036854776e+18 <= dVar5)) goto LAB_00131d03;
    uVar2 = (ulong)dVar5;
  }
  else {
    if (rc->tt_ != 0x13) {
LAB_00131d03:
      luaT_trybinTM(L,rb,rc,ra,TM_SHR);
      return;
    }
    uVar2 = (rc->value_).i;
  }
  uVar4 = -uVar2;
  pGVar1 = (GCObject *)0x0;
  if ((long)uVar2 < 1) {
    if (uVar4 < 0x40) {
      pGVar1 = (GCObject *)(uVar3 << (uVar4 & 0x3f));
    }
  }
  else if (0xffffffffffffffc0 < uVar4) {
    pGVar1 = (GCObject *)(uVar3 >> (uVar2 & 0x3f));
  }
  (ra->value_).gc = pGVar1;
  ra->tt_ = 0x13;
  return;
}

Assistant:

void raviV_op_shr(lua_State *L, TValue *ra, TValue *rb, TValue *rc) {
  lua_Integer ib;
  lua_Integer ic;
  if (tointegerns(rb, &ib) && tointegerns(rc, &ic)) {
    setivalue(ra, luaV_shiftl(ib, -ic));
  }
  else {
    luaT_trybinTM(L, rb, rc, ra, TM_SHR);
  }
}